

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupMux(int iVar,Gia_Man_t *pCof1,Gia_Man_t *pCof0)

{
  uint uVar1;
  int iVar2;
  int iData0;
  Gia_Man_t *p;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  long lVar8;
  Gia_Man_t *pGia [2];
  Gia_Man_t *local_48 [3];
  
  local_48[0] = pCof0;
  local_48[1] = pCof1;
  if (pCof0->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pCof0) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x666,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if (pCof1->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pCof1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x667,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if (pCof0->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(pCof0) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x668,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if (pCof1->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(pCof1) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x669,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  iVar7 = pCof1->vCis->nSize;
  if (iVar7 != pCof0->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pCof1) == Gia_ManCiNum(pCof0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x66a,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if ((iVar < 0) || (iVar7 <= iVar)) {
    __assert_fail("iVar >= 0 && iVar < Gia_ManCiNum(pCof1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x66b,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  p = Gia_ManStart(pCof0->nObjs + pCof1->nObjs);
  pcVar3 = Abc_UtilStrsav(pCof1->pName);
  p->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(pCof1->pSpec);
  p->pSpec = pcVar3;
  Gia_ManHashAlloc(p);
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    pGVar6 = local_48[lVar8];
    Gia_ManFillValue(pGVar6);
    pGVar6->pObjs->Value = 0;
    for (iVar7 = 0; iVar7 < pGVar6->vCis->nSize; iVar7 = iVar7 + 1) {
      pGVar4 = Gia_ManCi(pGVar6,iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (lVar8 == 0) {
        uVar1 = Gia_ManAppendCi(p);
      }
      else {
        pGVar5 = Gia_ManCi(pCof0,iVar7);
        uVar1 = pGVar5->Value;
      }
      pGVar4->Value = uVar1;
    }
    for (iVar7 = 0; iVar7 < pGVar6->vCos->nSize; iVar7 = iVar7 + 1) {
      pGVar4 = Gia_ManCo(pGVar6,iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      Gia_ManDupCofactorVar_rec
                (p,pGVar6,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff));
    }
  }
  for (iVar7 = 0; iVar7 < pCof0->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar4 = Gia_ManCo(pCof0,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar5 = Gia_ManCi(pCof0,iVar);
    uVar1 = pGVar5->Value;
    pGVar5 = Gia_ManCo(pCof1,iVar7);
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    iData0 = Gia_ObjFanin0Copy(pGVar4);
    iVar2 = Gia_ManHashMux(p,uVar1,iVar2,iData0);
    Gia_ManAppendCo(p,iVar2);
  }
  pGVar6 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupMux( int iVar, Gia_Man_t * pCof1, Gia_Man_t * pCof0 )
{
    Gia_Man_t * pGia[2] = {pCof0, pCof1};
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, n;
    assert( Gia_ManRegNum(pCof0) == 0 );
    assert( Gia_ManRegNum(pCof1) == 0 );
    assert( Gia_ManCoNum(pCof0) == 1 );
    assert( Gia_ManCoNum(pCof1) == 1 );
    assert( Gia_ManCiNum(pCof1) == Gia_ManCiNum(pCof0) );
    assert( iVar >= 0 && iVar < Gia_ManCiNum(pCof1) );
    pNew = Gia_ManStart( Gia_ManObjNum(pCof1) + Gia_ManObjNum(pCof0) );
    pNew->pName = Abc_UtilStrsav( pCof1->pName );
    pNew->pSpec = Abc_UtilStrsav( pCof1->pSpec );
    Gia_ManHashAlloc( pNew );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManFillValue( pGia[n] );
        Gia_ManConst0(pGia[n])->Value = 0;
        Gia_ManForEachCi( pGia[n], pObj, i )
            pObj->Value = n ? Gia_ManCi(pGia[0], i)->Value : Gia_ManAppendCi(pNew);
        Gia_ManForEachCo( pGia[n], pObj, i )
            Gia_ManDupCofactorVar_rec( pNew, pGia[n], Gia_ObjFanin0(pObj) );
    }
    Gia_ManForEachCo( pGia[0], pObj, i )
    {
        int Ctrl = Gia_ManCi(pGia[0], iVar)->Value;
        int Lit1 = Gia_ObjFanin0Copy(Gia_ManCo(pGia[1], i));
        int Lit0 = Gia_ObjFanin0Copy(pObj);
        Gia_ManAppendCo( pNew, Gia_ManHashMux( pNew, Ctrl, Lit1, Lit0 ) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}